

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O3

void __thiscall SerialTaskRunner::insert(SerialTaskRunner *this,function<void_()> func)

{
  function<void_()> *in_RSI;
  long in_FS_OFFSET;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->m_callbacks_mutex).super_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
  _M_insert<std::function<void()>>
            ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
             &this->m_callbacks_pending,(iterator)&this->m_callbacks_pending,in_RSI);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  MaybeScheduleProcessQueue(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::insert(std::function<void()> func)
{
    {
        LOCK(m_callbacks_mutex);
        m_callbacks_pending.emplace_back(std::move(func));
    }
    MaybeScheduleProcessQueue();
}